

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

Matrix * __thiscall
QPDFPageObjectHelper::getMatrixForTransformations
          (Matrix *__return_storage_ptr__,QPDFPageObjectHelper *this,bool invert)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_XMM0_Qb;
  Rectangle rect;
  QPDFObjectHandle scale_obj;
  QPDFObjectHandle rotate_obj;
  QPDFObjectHandle bbox;
  Rectangle local_98;
  double local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  __return_storage_ptr__->a = 1.0;
  __return_storage_ptr__->b = 0.0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 1.0;
  __return_storage_ptr__->e = 0.0;
  __return_storage_ptr__->f = 0.0;
  getTrimBox((QPDFPageObjectHelper *)&stack0xffffffffffffffd0,SUB81(this,0),false);
  bVar2 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (!bVar2) goto LAB_001d9378;
  pdVar1 = &local_98.urx;
  local_98.llx = (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/Rotate","");
  getAttribute((QPDFPageObjectHelper *)&local_40,(string *)this,SUB81(&local_98,0));
  if ((double *)local_98.llx != pdVar1) {
    operator_delete((void *)local_98.llx,(long)local_98.urx + 1);
  }
  local_98.llx = (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/UserUnit","");
  getAttribute((QPDFPageObjectHelper *)&local_50,(string *)this,SUB81(&local_98,0));
  if ((double *)local_98.llx != pdVar1) {
    operator_delete((void *)local_98.llx,(long)local_98.urx + 1);
  }
  bVar2 = QPDFObjectHandle::isNull(&local_40);
  if (bVar2) {
    bVar2 = QPDFObjectHandle::isNull(&local_50);
    if (!bVar2) goto LAB_001d91ac;
  }
  else {
LAB_001d91ac:
    QPDFObjectHandle::getArrayAsRectangle(&local_98,(QPDFObjectHandle *)&stack0xffffffffffffffd0);
    local_58 = local_98.urx - local_98.llx;
    local_60 = local_98.ury - local_98.lly;
    bVar2 = QPDFObjectHandle::isNumber(&local_50);
    if (bVar2) {
      local_78 = QPDFObjectHandle::getNumericValue(&local_50);
      uStack_70 = extraout_XMM0_Qb;
    }
    else {
      local_78 = 1.0;
      uStack_70 = 0;
    }
    bVar2 = QPDFObjectHandle::isInteger(&local_40);
    iVar3 = 0;
    if (bVar2) {
      iVar3 = QPDFObjectHandle::getIntValueAsInt(&local_40);
    }
    if (invert) {
      if ((local_78 == 0.0) && (!NAN(local_78))) goto LAB_001d935a;
      local_78 = 1.0 / local_78;
      iVar3 = 0x168 - iVar3;
      uStack_70 = 0;
    }
    if (iVar3 == 0x10e) {
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = local_78;
      __return_storage_ptr__->c = -local_78;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->e = local_60 * local_78;
      __return_storage_ptr__->f = 0.0;
    }
    else if (iVar3 == 0xb4) {
      __return_storage_ptr__->a = -local_78;
      __return_storage_ptr__->b = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = -local_78;
      __return_storage_ptr__->e = local_58 * local_78;
      __return_storage_ptr__->f = local_60 * local_78;
    }
    else if (iVar3 == 0x5a) {
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = -local_78;
      __return_storage_ptr__->c = local_78;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = local_58 * local_78;
    }
    else {
      __return_storage_ptr__->a = local_78;
      __return_storage_ptr__->b = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = local_78;
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = 0.0;
    }
  }
LAB_001d935a:
  if ((element_type *)
      local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((element_type *)
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
LAB_001d9378:
  if ((element_type *)local_28._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFPageObjectHelper::getMatrixForTransformations(bool invert)
{
    QPDFObjectHandle::Matrix matrix(1, 0, 0, 1, 0, 0);
    QPDFObjectHandle bbox = getTrimBox(false);
    if (!bbox.isRectangle()) {
        return matrix;
    }
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (!(rotate_obj.isNull() && scale_obj.isNull())) {
        QPDFObjectHandle::Rectangle rect = bbox.getArrayAsRectangle();
        double width = rect.urx - rect.llx;
        double height = rect.ury - rect.lly;
        double scale = (scale_obj.isNumber() ? scale_obj.getNumericValue() : 1.0);
        int rotate = (rotate_obj.isInteger() ? rotate_obj.getIntValueAsInt() : 0);
        if (invert) {
            if (scale == 0.0) {
                return matrix;
            }
            scale = 1.0 / scale;
            rotate = 360 - rotate;
        }

        // Ignore invalid rotation angle
        switch (rotate) {
        case 90:
            matrix = QPDFObjectHandle::Matrix(0, -scale, scale, 0, 0, width * scale);
            break;
        case 180:
            matrix = QPDFObjectHandle::Matrix(-scale, 0, 0, -scale, width * scale, height * scale);
            break;
        case 270:
            matrix = QPDFObjectHandle::Matrix(0, scale, -scale, 0, height * scale, 0);
            break;
        default:
            matrix = QPDFObjectHandle::Matrix(scale, 0, 0, scale, 0, 0);
            break;
        }
    }
    return matrix;
}